

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O2

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitUnaryLogNot(AsmJSByteCodeGenerator *this,ParseNode *pnode)

{
  bool bVar1;
  ParseNode *pnode_00;
  EmitExpressionInfo EVar2;
  AsmJsCompilationException *this_00;
  OpCodeAsmJs OVar3;
  EmitExpressionInfo local_38;
  
  pnode_00 = ParserWrapper::GetUnaryNode(pnode);
  OVar3 = ExtendedOpcodePrefix;
  for (; pnode_00->nop == knopLogNot; pnode_00 = ParserWrapper::GetUnaryNode(pnode_00)) {
    OVar3 = OVar3 + ExtendedOpcodePrefix;
  }
  local_38 = Emit(this,pnode_00);
  StartStatement(this,pnode);
  bVar1 = AsmJsType::isInt(&local_38.type);
  if (bVar1) {
    bVar1 = AsmJsFunc::IsValidLocation<int>(this->mFunction,&local_38);
    if (bVar1) {
      EVar2.super_EmitInfoBase.location = GetAndReleaseUnaryLocations<int>(this,&local_38);
      AsmJsByteCodeWriter::AsmReg2
                (&this->mWriter,OVar3 & ExtendedOpcodePrefix ^ Conv_ITB,
                 EVar2.super_EmitInfoBase.location,local_38.super_EmitInfoBase.location);
      ByteCodeWriter::EndStatement(&(this->mWriter).super_ByteCodeWriter,pnode);
      EVar2.type.which_ = Int;
      return EVar2;
    }
    this_00 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_00,L"Invalid Node location[%d] ",(ulong)local_38 & 0xffffffff);
  }
  else {
    this_00 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException(this_00,L"Type not supported for unary !");
  }
  __cxa_throw(this_00,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

Js::EmitExpressionInfo AsmJSByteCodeGenerator::EmitUnaryLogNot( ParseNode * pnode )
    {
        ParseNode* rhs = ParserWrapper::GetUnaryNode( pnode );
        int count = 1;
        while( rhs->nop == knopLogNot )
        {
            ++count;
            rhs = ParserWrapper::GetUnaryNode( rhs );
        }

        const EmitExpressionInfo& rhsEmit = Emit( rhs );
        const AsmJsType& rType = rhsEmit.type;
        StartStatement(pnode);
        EmitExpressionInfo emitInfo( AsmJsType::Int );
        if( rType.isInt() )
        {
            CheckNodeLocation( rhsEmit, int );
            RegSlot dst = GetAndReleaseUnaryLocations<int>( &rhsEmit );
            if( count & 1 )
            {
                // do the conversion only if we have an odd number of the operator
                mWriter.AsmReg2( OpCodeAsmJs::LogNot_Int, dst, rhsEmit.location );
            }
            else
            {
                // otherwise, make sure the result is 0|1
                mWriter.AsmReg2( OpCodeAsmJs::Conv_ITB, dst, rhsEmit.location );
            }
            emitInfo.location = dst;
        }
        else
        {
            throw AsmJsCompilationException( _u("Type not supported for unary !") );
        }
        EndStatement(pnode);
        return emitInfo;
    }